

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O2

bool dxil_spv::emit_physical_buffer_store_instruction
               (Impl *impl,CallInst *instruction,PhysicalPointerMeta *ptr_meta,uint32_t alignment)

{
  uint32_t uVar1;
  bool bVar2;
  uint8_t uVar3;
  Id IVar4;
  uint uVar5;
  Id type_id;
  Id IVar6;
  Builder *pBVar7;
  Value *pVVar8;
  Type *element_type;
  Operation *pOVar9;
  Operation *pOVar10;
  LoggingCallback p_Var11;
  void *pvVar12;
  uint uVar13;
  uint i;
  long lVar14;
  uint32_t mask;
  Builder *local_1070;
  PhysicalPointerMeta *local_1068;
  Id local_1060;
  uint32_t alignment_local;
  Id local_1058;
  uint local_1054;
  Op value_cast_op;
  Id physical_type_id;
  PhysicalPointerMeta tmp_ptr_meta;
  Id elems [4];
  
  alignment_local = alignment;
  pBVar7 = Converter::Impl::builder(impl);
  mask = 0;
  bVar2 = get_constant_operand(&instruction->super_Instruction,8,&mask);
  if ((bVar2) &&
     ((alignment != 0 ||
      (bVar2 = get_constant_operand(&instruction->super_Instruction,9,&alignment_local), bVar2)))) {
    uVar1 = mask;
    if (mask == 1) {
      uVar13 = 1;
    }
    else if (mask == 3) {
      uVar13 = 2;
    }
    else if (mask == 0xf) {
      uVar13 = 4;
    }
    else {
      if (mask != 7) {
        p_Var11 = get_thread_log_callback();
        if (p_Var11 != (LoggingCallback)0x0) {
          snprintf((char *)elems,0x1000,"Unexpected mask for RawBufferStore = %u.\n",(ulong)mask);
          pvVar12 = get_thread_log_callback_userdata();
          (*p_Var11)(pvVar12,Error,(char *)elems);
          return false;
        }
        fprintf(_stderr,"[ERROR]: Unexpected mask for RawBufferStore = %u.\n",(ulong)mask);
        fflush(_stderr);
        return false;
      }
      uVar13 = 3;
    }
    local_1070 = pBVar7;
    local_1068 = ptr_meta;
    pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
    element_type = LLVMBC::Value::getType(pVVar8);
    local_1060 = build_vectorized_physical_load_store_access(impl,instruction,uVar13,element_type);
    get_physical_load_store_cast_info(impl,element_type,&physical_type_id,&value_cast_op);
    IVar4 = physical_type_id;
    if (uVar1 != 1) {
      IVar4 = spv::Builder::makeVectorType(local_1070,physical_type_id,uVar13);
    }
    IVar6 = local_1060;
    tmp_ptr_meta.size = local_1068->size;
    tmp_ptr_meta.nonwritable = local_1068->nonwritable;
    tmp_ptr_meta.nonreadable = local_1068->nonreadable;
    tmp_ptr_meta.coherent = local_1068->coherent;
    tmp_ptr_meta.rov = local_1068->rov;
    tmp_ptr_meta.stride = local_1068->stride;
    tmp_ptr_meta._5_3_ = *(undefined3 *)&local_1068->field_0x5;
    if (local_1060 == 0) {
      uVar3 = '\0';
    }
    else {
      uVar5 = get_type_scalar_alignment(impl,element_type);
      uVar3 = (char)uVar5 * (char)uVar13;
    }
    tmp_ptr_meta.stride = uVar3;
    local_1054 = uVar13;
    type_id = Converter::Impl::get_physical_pointer_block_type(impl,IVar4,&tmp_ptr_meta);
    if (IVar6 == 0) {
      IVar6 = build_physical_pointer_address_for_raw_load_store(impl,instruction);
    }
    else {
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      IVar6 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
    }
    emit_buffer_synchronization_validation(impl,instruction,Store);
    pOVar9 = Converter::Impl::allocate(impl,OpBitcast,type_id);
    Operation::add_id(pOVar9,IVar6);
    Converter::Impl::add(impl,pOVar9,false);
    pBVar7 = local_1070;
    local_1058 = IVar4;
    IVar4 = spv::Builder::makePointer(local_1070,StorageClassPhysicalStorageBuffer,IVar4);
    pOVar10 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar4);
    Operation::add_id(pOVar10,pOVar9->id);
    IVar4 = spv::Builder::makeUintConstant(pBVar7,0,false);
    Operation::add_id(pOVar10,IVar4);
    if (local_1060 != 0) {
      Operation::add_id(pOVar10,local_1060);
    }
    Converter::Impl::add(impl,pOVar10,false);
    elems[0] = 0;
    elems[1] = 0;
    elems[2] = 0;
    elems[3] = 0;
    for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
      uVar13 = (uint)lVar14 | 4;
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar13);
      Converter::Impl::register_externally_visible_write(impl,pVVar8);
      pVVar8 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,uVar13);
      IVar4 = Converter::Impl::get_id_for_value(impl,pVVar8,0);
      elems[lVar14] = IVar4;
    }
    pOVar9 = Converter::Impl::allocate(impl,OpStore);
    Operation::add_id(pOVar9,pOVar10->id);
    IVar4 = Converter::Impl::build_vector(impl,physical_type_id,elems,local_1054);
    if (value_cast_op != OpNop) {
      pOVar10 = Converter::Impl::allocate(impl,value_cast_op,local_1058);
      Operation::add_id(pOVar10,IVar4);
      Converter::Impl::add(impl,pOVar10,false);
      IVar4 = pOVar10->id;
    }
    Operation::add_id(pOVar9,IVar4);
    Operation::add_literal(pOVar9,2);
    Operation::add_literal(pOVar9,alignment_local);
    Converter::Impl::add(impl,pOVar9,local_1068->rov);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool emit_physical_buffer_store_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                   const Converter::Impl::PhysicalPointerMeta &ptr_meta,
                                                   uint32_t alignment = 0)
{
	auto &builder = impl.builder();

	uint32_t mask = 0;
	if (!get_constant_operand(instruction, 8, &mask))
		return false;

	if (alignment == 0 && !get_constant_operand(instruction, 9, &alignment))
		return false;

	unsigned vecsize = 0;
	if (mask == 1)
		vecsize = 1;
	else if (mask == 3)
		vecsize = 2;
	else if (mask == 7)
		vecsize = 3;
	else if (mask == 15)
		vecsize = 4;
	else
	{
		LOGE("Unexpected mask for RawBufferStore = %u.\n", mask);
		return false;
	}

	auto *element_type = instruction->getOperand(4)->getType();

	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	spv::Id array_id = build_vectorized_physical_load_store_access(impl, instruction, vecsize, element_type);

	spv::Id physical_type_id;
	spv::Op value_cast_op;
	get_physical_load_store_cast_info(impl, element_type, physical_type_id, value_cast_op);

	spv::Id vec_type_id = physical_type_id;
	if (vecsize > 1)
		vec_type_id = builder.makeVectorType(physical_type_id, vecsize);

	auto tmp_ptr_meta = ptr_meta;
	tmp_ptr_meta.stride = array_id ? vecsize * get_type_scalar_alignment(impl, element_type) : 0;
	spv::Id ptr_type_id = impl.get_physical_pointer_block_type(vec_type_id, tmp_ptr_meta);

	spv::Id u64_ptr_id;
	if (array_id)
		u64_ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	else
		u64_ptr_id = build_physical_pointer_address_for_raw_load_store(impl, instruction);

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Store);

	auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
	ptr_bitcast_op->add_id(u64_ptr_id);
	impl.add(ptr_bitcast_op);

	auto *chain_op = impl.allocate(spv::OpInBoundsAccessChain,
								   builder.makePointer(spv::StorageClassPhysicalStorageBuffer, vec_type_id));
	chain_op->add_id(ptr_bitcast_op->id);
	chain_op->add_id(builder.makeUintConstant(0));
	if (array_id)
		chain_op->add_id(array_id);
	impl.add(chain_op);

	spv::Id elems[4] = {};
	for (unsigned i = 0; i < 4; i++)
	{
		impl.register_externally_visible_write(instruction->getOperand(4 + i));
		elems[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
	}

	auto *store_op = impl.allocate(spv::OpStore);
	store_op->add_id(chain_op->id);

	spv::Id vec_id = impl.build_vector(physical_type_id, elems, vecsize);
	if (value_cast_op != spv::OpNop)
	{
		auto *op = impl.allocate(value_cast_op, vec_type_id);
		op->add_id(vec_id);
		impl.add(op);
		vec_id = op->id;
	}

	store_op->add_id(vec_id);
	store_op->add_literal(spv::MemoryAccessAlignedMask);
	store_op->add_literal(alignment);

	impl.add(store_op, ptr_meta.rov);

	return true;
}